

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O0

void JsrtDebugUtils::AddFileNameOrScriptTypeToObject
               (DynamicObject *object,Utf8SourceInfo *utf8SourceInfo)

{
  code *pcVar1;
  char16_t *value;
  LPCWSTR value_00;
  Utf8SourceInfo *pUVar2;
  bool bVar3;
  undefined4 *puVar4;
  SourceContextInfo *pSVar5;
  size_t sVar6;
  ScriptContext *pSVar7;
  char16_t *local_68;
  char16 *local_48;
  JsrtDebugPropertyId local_3c;
  char16_t *local_38;
  char16 *url;
  LPCWSTR local_28;
  LPCWSTR sourceName;
  FunctionBody *anyFunctionBody;
  Utf8SourceInfo *utf8SourceInfo_local;
  DynamicObject *object_local;
  
  anyFunctionBody = (FunctionBody *)utf8SourceInfo;
  utf8SourceInfo_local = (Utf8SourceInfo *)object;
  bVar3 = Js::Utf8SourceInfo::IsDynamic(utf8SourceInfo);
  if (bVar3) {
    pSVar5 = Js::Utf8SourceInfo::GetSourceContextInfo((Utf8SourceInfo *)anyFunctionBody);
    if ((pSVar5->field_5).field_0.url != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugUtils.cpp"
                         ,0x1c,"(utf8SourceInfo->GetSourceContextInfo()->url == nullptr)",
                         "How come dynamic code have a url?");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    sourceName = (LPCWSTR)Js::Utf8SourceInfo::GetAnyParsedFunction
                                    ((Utf8SourceInfo *)anyFunctionBody);
    if ((FunctionBody *)sourceName == (FunctionBody *)0x0) {
      local_48 = L"Unknown script code";
    }
    else {
      local_48 = Js::ParseableFunctionInfo::GetSourceName((ParseableFunctionInfo *)sourceName);
    }
    pUVar2 = utf8SourceInfo_local;
    local_28 = local_48;
    JsrtDebugPropertyId::JsrtDebugPropertyId((JsrtDebugPropertyId *)((long)&url + 4),scriptType);
    value_00 = local_28;
    sVar6 = PAL_wcslen(local_28);
    pSVar7 = Js::Utf8SourceInfo::GetScriptContext((Utf8SourceInfo *)anyFunctionBody);
    AddPropertyToObject((DynamicObject *)pUVar2,url._4_4_,value_00,sVar6,pSVar7);
  }
  else {
    pSVar5 = Js::Utf8SourceInfo::GetSourceContextInfo((Utf8SourceInfo *)anyFunctionBody);
    if ((pSVar5->field_5).field_0.url == (Type)0x0) {
      local_68 = L"";
    }
    else {
      pSVar5 = Js::Utf8SourceInfo::GetSourceContextInfo((Utf8SourceInfo *)anyFunctionBody);
      local_68 = (pSVar5->field_5).field_0.url;
    }
    pUVar2 = utf8SourceInfo_local;
    local_38 = local_68;
    JsrtDebugPropertyId::JsrtDebugPropertyId(&local_3c,fileName);
    value = local_38;
    sVar6 = PAL_wcslen(local_38);
    pSVar7 = Js::Utf8SourceInfo::GetScriptContext((Utf8SourceInfo *)anyFunctionBody);
    AddPropertyToObject((DynamicObject *)pUVar2,local_3c,value,sVar6,pSVar7);
  }
  return;
}

Assistant:

void JsrtDebugUtils::AddFileNameOrScriptTypeToObject(Js::DynamicObject* object, Js::Utf8SourceInfo* utf8SourceInfo)
{
    if (utf8SourceInfo->IsDynamic())
    {
        AssertMsg(utf8SourceInfo->GetSourceContextInfo()->url == nullptr, "How come dynamic code have a url?");

        Js::FunctionBody* anyFunctionBody = utf8SourceInfo->GetAnyParsedFunction();

        LPCWSTR sourceName = (anyFunctionBody != nullptr) ? anyFunctionBody->GetSourceName() : Js::Constants::UnknownScriptCode;

        JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::scriptType, sourceName, wcslen(sourceName), utf8SourceInfo->GetScriptContext());
    }
    else
    {
        // url can be nullptr if JsParseScript/JsRunScript didn't passed any
        const char16* url = utf8SourceInfo->GetSourceContextInfo()->url == nullptr ? _u("") : utf8SourceInfo->GetSourceContextInfo()->url;
        JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::fileName, url, wcslen(url), utf8SourceInfo->GetScriptContext());
    }
}